

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

Range bssl::FirstUnmarkedRangeInByte(uint8_t b)

{
  Range RVar1;
  ulong local_30;
  size_t end;
  size_t start;
  uint8_t b_local;
  
  end = 0;
  while ((end < 8 && (((uint)b & 1 << ((byte)end & 0x1f)) != 0))) {
    end = end + 1;
  }
  local_30 = end;
  while ((local_30 < 8 && (((uint)b & 1 << ((byte)local_30 & 0x1f)) == 0))) {
    local_30 = local_30 + 1;
  }
  RVar1.end = local_30;
  RVar1.start = end;
  return RVar1;
}

Assistant:

static DTLSMessageBitmap::Range FirstUnmarkedRangeInByte(uint8_t b) {
  size_t start, end;
  for (start = 0; start < 8; start++) {
    if ((b & (1u << start)) == 0) {
      break;
    }
  }
  for (end = start; end < 8; end++) {
    if ((b & (1u << end)) != 0) {
      break;
    }
  }
  return DTLSMessageBitmap::Range{start, end};
}